

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

uint __thiscall llvm::yaml::Output::beginFlowSequence(Output *this)

{
  StringRef Str;
  InState local_14;
  
  SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::push_back
            ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)&this->StateStack,
             &local_14);
  newLineCheck(this);
  this->ColumnAtFlowStart = this->Column;
  this->Column = this->Column + 2;
  Str.Length = 2;
  Str.Data = "[ ";
  raw_ostream::operator<<(this->Out,Str);
  this->NeedFlowSequenceComma = false;
  return 0;
}

Assistant:

unsigned Output::beginFlowSequence() {
  StateStack.push_back(inFlowSeqFirstElement);
  newLineCheck();
  ColumnAtFlowStart = Column;
  output("[ ");
  NeedFlowSequenceComma = false;
  return 0;
}